

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O3

void anon_unknown.dwarf_23d889::readValidateFile
               (char *pFilename,int pHeight,int pWidth,EImageType pImageType,bool pIsStereo)

{
  char *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  Header *pHVar5;
  Box2i *pBVar6;
  half *phVar7;
  size_t sVar8;
  undefined1 in_R10B;
  Data *pDVar9;
  ulong uVar10;
  char *pcVar11;
  _func_int **pp_Var12;
  int pWidth_local;
  int pHeight_local;
  half *local_110;
  char *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  size_t local_f0;
  int local_e4;
  InputFile lFile_1;
  InputFile lFile;
  Array2D<half> lPixels;
  FrameBuffer lInputFrameBuffer;
  Slice local_68;
  
  if (pImageType == IMAGE_TYPE_RGB) {
    local_f8 = 3;
  }
  else {
    if (pImageType == IMAGE_TYPE_OTHER) {
      local_f8 = 2;
      local_100 = CONCAT44(local_100._4_4_,1);
      goto LAB_00186c8d;
    }
    local_f8 = 4;
  }
  local_100 = (ulong)local_100._4_4_ << 0x20;
LAB_00186c8d:
  lPixels._sizeX = 0;
  lPixels._sizeY = 0;
  lPixels._data = (half *)0x0;
  pp_Var12 = (_func_int **)(long)pHeight;
  pDVar9 = (Data *)(long)(pWidth * (int)local_f8);
  uVar10 = 0xffffffffffffffff;
  if (-1 < (long)pDVar9 * (long)pp_Var12) {
    uVar10 = (long)pDVar9 * (long)pp_Var12 * 2;
  }
  pWidth_local = pWidth;
  pHeight_local = pHeight;
  local_110 = (half *)operator_new__(uVar10);
  lPixels._sizeX = (long)pp_Var12;
  lPixels._sizeY = (long)pDVar9;
  lPixels._data = local_110;
  if (pIsStereo) {
    local_108 = (char *)operator_new__(uVar10);
    lFile_1.super_GenericInputFile._vptr_GenericInputFile = pp_Var12;
    lFile_1._data = pDVar9;
    iVar4 = Imf_2_5::globalThreadCount();
    uVar2 = local_f8;
    Imf_2_5::InputFile::InputFile(&lFile,pFilename,iVar4);
    pHVar5 = Imf_2_5::InputFile::header(&lFile);
    pBVar6 = Imf_2_5::Header::dataWindow(pHVar5);
    iVar4 = (pBVar6->min).y;
    local_e4 = (pBVar6->max).y;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_f0 = (size_t)(uint)((int)uVar2 * 2);
    sVar8 = (long)(((pBVar6->max).x - (pBVar6->min).x) + 1) * local_f0;
    local_100 = (ulong)(uint)((int)uVar2 * 8);
    uVar10 = 0;
    phVar7 = local_110;
    pcVar11 = local_108;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pcVar1 = *(char **)((long)&(anonymous_namespace)::CHANNEL_NAMES + uVar10);
      Imf_2_5::Slice::Slice
                (&local_68,HALF,(char *)phVar7,local_f0,sVar8,1,1,
                 (double)half::_toFloat[(anonymous_namespace)::ALPHA_DEFAULT_VALUE].f,(bool)in_R10B,
                 false);
      Imf_2_5::FrameBuffer::insert(&lInputFrameBuffer,pcVar1,&local_68);
      pcVar1 = *(char **)((long)&(anonymous_namespace)::CHANNEL_NAMES_LEFT + uVar10);
      Imf_2_5::Slice::Slice
                (&local_68,HALF,pcVar11,local_f0,sVar8,1,1,
                 (double)half::_toFloat[(anonymous_namespace)::ALPHA_DEFAULT_VALUE].f,(bool)in_R10B,
                 false);
      Imf_2_5::FrameBuffer::insert(&lInputFrameBuffer,pcVar1,&local_68);
      uVar10 = uVar10 + 8;
      pcVar11 = pcVar11 + 2;
      phVar7 = phVar7 + 1;
    } while (local_100 != uVar10);
    Imf_2_5::InputFile::setFrameBuffer(&lFile,&lInputFrameBuffer);
    Imf_2_5::InputFile::readPixels(&lFile,iVar4,local_e4);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&lInputFrameBuffer);
    Imf_2_5::InputFile::~InputFile(&lFile);
    iVar4 = (int)local_f8;
    validatePixels(&pHeight_local,&pWidth_local,&lPixels,iVar4,false);
    validatePixels(&pHeight_local,&pWidth_local,(Array2D<half> *)&lFile_1,iVar4,true);
    operator_delete__(local_108);
    phVar7 = local_110;
  }
  else {
    iVar4 = Imf_2_5::globalThreadCount();
    Imf_2_5::InputFile::InputFile(&lFile_1,pFilename,iVar4);
    phVar7 = local_110;
    pHVar5 = Imf_2_5::InputFile::header(&lFile_1);
    uVar2 = local_f8;
    pBVar6 = Imf_2_5::Header::dataWindow(pHVar5);
    local_108 = (char *)CONCAT44(local_108._4_4_,(pBVar6->min).y);
    iVar4 = (pBVar6->max).y;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_f0 = (size_t)(uint)((int)uVar2 * 2);
    sVar8 = (long)(((pBVar6->max).x - (pBVar6->min).x) + 1) * local_f0;
    uVar10 = 0;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pcVar11 = *(char **)((long)&(anonymous_namespace)::CHANNEL_NAMES + uVar10);
      Imf_2_5::Slice::Slice
                (&local_68,HALF,(char *)phVar7,local_f0,sVar8,1,1,
                 (double)half::_toFloat[(anonymous_namespace)::ALPHA_DEFAULT_VALUE].f,(bool)in_R10B,
                 false);
      Imf_2_5::FrameBuffer::insert(&lInputFrameBuffer,pcVar11,&local_68);
      uVar10 = uVar10 + 8;
      phVar7 = phVar7 + 1;
    } while ((uint)((int)uVar2 * 8) != uVar10);
    Imf_2_5::InputFile::setFrameBuffer(&lFile_1,&lInputFrameBuffer);
    phVar7 = local_110;
    bVar3 = Imf_2_5::InputFile::isOptimizationEnabled(&lFile_1);
    uVar2 = local_f8;
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," optimization enabled\n",0x16);
      if ((char)local_100 != '\0') {
        std::operator<<((ostream *)&std::cerr,
                        " error: isOptimizationEnabled returned TRUE, but optimization not known to work for two channel images\n"
                       );
        __assert_fail("pNbChannels!=2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testOptimized.cpp"
                      ,0x161,
                      "void (anonymous namespace)::readPixels(const char *, int, Array2D<half> &)");
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," optimization disabled\n",0x17);
    }
    Imf_2_5::InputFile::readPixels(&lFile_1,(int)local_108,iVar4);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&lInputFrameBuffer);
    Imf_2_5::InputFile::~InputFile(&lFile_1);
    validatePixels(&pHeight_local,&pWidth_local,&lPixels,(int)uVar2,false);
  }
  operator_delete__(phVar7);
  return;
}

Assistant:

void
readValidateFile (const char pFilename[],
                  int pHeight,
                  int pWidth,
                  EImageType
                  pImageType,
                  bool pIsStereo)
{
    const int lNbChannels = getNbChannels(pImageType);

    Array2D<half> lPixels;
    lPixels.resizeErase(pHeight, pWidth * lNbChannels);
    //readPixels(pFilename, lNbChannels, lPixels);
    //writePixels("pkTest.exr", pHeight, pWidth, lPixels, lNbChannels, NO_COMPRESSION);


    if(pIsStereo)
    {
        Array2D<half> lPixelsLeft;
        lPixelsLeft.resizeErase (pHeight, pWidth * lNbChannels);
        readPixels (pFilename, lNbChannels, lPixels, lPixelsLeft);
        validatePixels (pHeight, pWidth, lPixels, lNbChannels, false);
        validatePixels (pHeight, pWidth, lPixelsLeft, lNbChannels, true);
    }
    else
    {
        readPixels (pFilename, lNbChannels, lPixels);
        validatePixels (pHeight, pWidth, lPixels, lNbChannels, false);
    }
}